

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O3

string * __thiscall
CppGenerator::genSortFunction_abi_cxx11_
          (string *__return_storage_ptr__,CppGenerator *this,size_t *rel_id)

{
  pointer pcVar1;
  string *psVar2;
  bool bVar3;
  bool bVar4;
  long *plVar5;
  undefined8 *puVar6;
  Attribute *pAVar7;
  size_t __result;
  long *plVar8;
  ulong *puVar9;
  ulong uVar10;
  size_type *psVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  string relName;
  string returnString;
  string sortAlgo;
  long *local_258;
  long local_250;
  long local_248;
  long lStack_240;
  ulong *local_238;
  long local_230;
  ulong local_228;
  undefined8 uStack_220;
  ulong *local_218;
  long local_210;
  ulong local_208;
  long lStack_200;
  ulong *local_1f8;
  long local_1f0;
  ulong local_1e8;
  long lStack_1e0;
  ulong *local_1d8;
  long local_1d0;
  ulong local_1c8;
  undefined8 uStack_1c0;
  long *local_1b8;
  long local_1b0;
  long local_1a8;
  long lStack_1a0;
  long *local_198;
  long local_190;
  long local_188;
  long lStack_180;
  ulong *local_178;
  long local_170;
  ulong local_168;
  long lStack_160;
  ulong *local_158;
  long local_150;
  ulong local_148;
  long lStack_140;
  long *local_138;
  long local_130;
  long local_128;
  long lStack_120;
  long *local_118;
  long local_110;
  long local_108;
  long lStack_100;
  ulong *local_f8;
  long local_f0;
  ulong local_e8 [2];
  undefined1 *local_d8 [2];
  undefined1 local_c8 [16];
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  string *local_58;
  CppGenerator *local_50;
  size_t *local_48;
  TDNode *local_40;
  ulong local_38;
  
  local_50 = this;
  local_48 = rel_id;
  local_40 = TreeDecomposition::getRelation
                       ((this->_td).
                        super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        *rel_id);
  local_d8[0] = local_c8;
  pcVar1 = (local_40->_name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_d8,pcVar1,pcVar1 + (local_40->_name)._M_string_length);
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"std::sort(","");
  local_1f8 = &local_1e8;
  std::__cxx11::string::_M_construct((ulong)&local_1f8,'\x03');
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_1f8);
  local_1b8 = &local_1a8;
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_1a8 = *plVar8;
    lStack_1a0 = plVar5[3];
  }
  else {
    local_1a8 = *plVar8;
    local_1b8 = (long *)*plVar5;
  }
  local_1b0 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_1b8,(ulong)local_d8[0]);
  puVar9 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar9) {
    local_208 = *puVar9;
    lStack_200 = plVar5[3];
    local_218 = &local_208;
  }
  else {
    local_208 = *puVar9;
    local_218 = (ulong *)*plVar5;
  }
  local_210 = plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_218);
  puVar9 = puVar6 + 2;
  if ((ulong *)*puVar6 == puVar9) {
    local_228 = *puVar9;
    uStack_220 = puVar6[3];
    local_238 = &local_228;
  }
  else {
    local_228 = *puVar9;
    local_238 = (ulong *)*puVar6;
  }
  local_230 = puVar6[1];
  *puVar6 = puVar9;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  local_1d8 = &local_1c8;
  std::__cxx11::string::_M_construct((ulong)&local_1d8,'\x03');
  uVar14 = 0xf;
  if (local_238 != &local_228) {
    uVar14 = local_228;
  }
  if (uVar14 < (ulong)(local_1d0 + local_230)) {
    uVar14 = 0xf;
    if (local_1d8 != &local_1c8) {
      uVar14 = local_1c8;
    }
    if (uVar14 < (ulong)(local_1d0 + local_230)) goto LAB_00220048;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1d8,0,(char *)0x0,(ulong)local_238);
  }
  else {
LAB_00220048:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_238,(ulong)local_1d8);
  }
  local_258 = &local_248;
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_248 = *plVar5;
    lStack_240 = puVar6[3];
  }
  else {
    local_248 = *plVar5;
    local_258 = (long *)*puVar6;
  }
  local_250 = puVar6[1];
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_258);
  local_b8 = &local_a8;
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_a8 = *plVar8;
    lStack_a0 = plVar5[3];
  }
  else {
    local_a8 = *plVar8;
    local_b8 = (long *)*plVar5;
  }
  local_b0 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (local_258 != &local_248) {
    operator_delete(local_258);
  }
  if (local_1d8 != &local_1c8) {
    operator_delete(local_1d8);
  }
  if (local_238 != &local_228) {
    operator_delete(local_238);
  }
  if (local_218 != &local_208) {
    operator_delete(local_218);
  }
  if (local_1b8 != &local_1a8) {
    operator_delete(local_1b8);
  }
  if (local_1f8 != &local_1e8) {
    operator_delete(local_1f8);
  }
  if (multifaq::cppgen::BENCH_INDIVIDUAL == '\x01') {
    local_218 = &local_208;
    std::__cxx11::string::_M_construct((ulong)&local_218,'\x06');
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_218);
    puVar9 = puVar6 + 2;
    if ((ulong *)*puVar6 == puVar9) {
      local_228 = *puVar9;
      uStack_220 = puVar6[3];
      local_238 = &local_228;
    }
    else {
      local_228 = *puVar9;
      local_238 = (ulong *)*puVar6;
    }
    local_230 = puVar6[1];
    *puVar6 = puVar9;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_238);
    local_258 = &local_248;
    plVar5 = puVar6 + 2;
    if ((long *)*puVar6 == plVar5) {
      local_248 = *plVar5;
      lStack_240 = puVar6[3];
    }
    else {
      local_248 = *plVar5;
      local_258 = (long *)*puVar6;
    }
    local_250 = puVar6[1];
    *puVar6 = plVar5;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_258);
    if (local_258 != &local_248) {
      operator_delete(local_258);
    }
    if (local_238 != &local_228) {
      operator_delete(local_238);
    }
    if (local_218 != &local_208) {
      operator_delete(local_218);
    }
  }
  local_98[0] = local_88;
  std::__cxx11::string::_M_construct((ulong)local_98,'\x06');
  plVar5 = (long *)std::__cxx11::string::_M_append((char *)local_98,(ulong)local_78[0]);
  local_138 = &local_128;
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_128 = *plVar8;
    lStack_120 = plVar5[3];
  }
  else {
    local_128 = *plVar8;
    local_138 = (long *)*plVar5;
  }
  local_130 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_138,(ulong)local_d8[0]);
  local_178 = &local_168;
  puVar9 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar9) {
    local_168 = *puVar9;
    lStack_160 = plVar5[3];
  }
  else {
    local_168 = *puVar9;
    local_178 = (ulong *)*plVar5;
  }
  local_170 = plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_178);
  local_118 = &local_108;
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_108 = *plVar8;
    lStack_100 = plVar5[3];
  }
  else {
    local_108 = *plVar8;
    local_118 = (long *)*plVar5;
  }
  local_110 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_118,(ulong)local_d8[0]);
  local_198 = &local_188;
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_188 = *plVar8;
    lStack_180 = plVar5[3];
  }
  else {
    local_188 = *plVar8;
    local_198 = (long *)*plVar5;
  }
  local_190 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_198);
  local_158 = &local_148;
  puVar9 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar9) {
    local_148 = *puVar9;
    lStack_140 = plVar5[3];
  }
  else {
    local_148 = *puVar9;
    local_158 = (ulong *)*plVar5;
  }
  local_150 = plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_d8[0]);
  puVar9 = puVar6 + 2;
  if ((ulong *)*puVar6 == puVar9) {
    local_1c8 = *puVar9;
    uStack_1c0 = puVar6[3];
    local_1d8 = &local_1c8;
  }
  else {
    local_1c8 = *puVar9;
    local_1d8 = (ulong *)*puVar6;
  }
  local_1d0 = puVar6[1];
  *puVar6 = puVar9;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_1d8);
  puVar9 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar9) {
    local_1e8 = *puVar9;
    lStack_1e0 = plVar5[3];
    local_1f8 = &local_1e8;
  }
  else {
    local_1e8 = *puVar9;
    local_1f8 = (ulong *)*plVar5;
  }
  local_1f0 = plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_1f8,(ulong)local_d8[0]);
  local_1b8 = &local_1a8;
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_1a8 = *plVar8;
    lStack_1a0 = plVar5[3];
  }
  else {
    local_1a8 = *plVar8;
    local_1b8 = (long *)*plVar5;
  }
  local_1b0 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_1b8);
  puVar9 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar9) {
    local_208 = *puVar9;
    lStack_200 = plVar5[3];
    local_218 = &local_208;
  }
  else {
    local_208 = *puVar9;
    local_218 = (ulong *)*plVar5;
  }
  local_210 = plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_f8 = local_e8;
  std::__cxx11::string::_M_construct((ulong)&local_f8,'\x06');
  uVar14 = 0xf;
  if (local_218 != &local_208) {
    uVar14 = local_208;
  }
  if (uVar14 < (ulong)(local_f0 + local_210)) {
    uVar14 = 0xf;
    if (local_f8 != local_e8) {
      uVar14 = local_e8[0];
    }
    if (uVar14 < (ulong)(local_f0 + local_210)) goto LAB_0022069f;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,(ulong)local_218);
  }
  else {
LAB_0022069f:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_218,(ulong)local_f8);
  }
  puVar9 = puVar6 + 2;
  if ((ulong *)*puVar6 == puVar9) {
    local_228 = *puVar9;
    uStack_220 = puVar6[3];
    local_238 = &local_228;
  }
  else {
    local_228 = *puVar9;
    local_238 = (ulong *)*puVar6;
  }
  local_230 = puVar6[1];
  *puVar6 = puVar9;
  puVar6[1] = 0;
  *(undefined1 *)puVar9 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_238);
  local_258 = &local_248;
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_248 = *plVar8;
    lStack_240 = plVar5[3];
  }
  else {
    local_248 = *plVar8;
    local_258 = (long *)*plVar5;
  }
  local_250 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_258);
  if (local_258 != &local_248) {
    operator_delete(local_258);
  }
  if (local_238 != &local_228) {
    operator_delete(local_238);
  }
  if (local_f8 != local_e8) {
    operator_delete(local_f8);
  }
  if (local_218 != &local_208) {
    operator_delete(local_218);
  }
  if (local_1b8 != &local_1a8) {
    operator_delete(local_1b8);
  }
  if (local_1f8 != &local_1e8) {
    operator_delete(local_1f8);
  }
  if (local_1d8 != &local_1c8) {
    operator_delete(local_1d8);
  }
  if (local_158 != &local_148) {
    operator_delete(local_158);
  }
  if (local_198 != &local_188) {
    operator_delete(local_198);
  }
  if (local_118 != &local_108) {
    operator_delete(local_118);
  }
  if (local_178 != &local_168) {
    operator_delete(local_178);
  }
  if (local_138 != &local_128) {
    operator_delete(local_138);
  }
  local_58 = __return_storage_ptr__;
  if (local_98[0] != local_88) {
    operator_delete(local_98[0]);
  }
  uVar14 = 0;
  while( true ) {
    lVar13 = 0;
    uVar10 = 0;
    bVar3 = true;
    do {
      bVar4 = bVar3;
      uVar12 = (local_40->_bag).super__Base_bitset<2UL>._M_w[lVar13];
      uVar12 = uVar12 - (uVar12 >> 1 & 0x5555555555555555);
      uVar12 = (uVar12 >> 2 & 0x3333333333333333) + (uVar12 & 0x3333333333333333);
      uVar10 = uVar10 + (((uVar12 >> 4) + uVar12 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
      lVar13 = 1;
      bVar3 = false;
    } while (bVar4);
    if (uVar10 <= uVar14) break;
    local_38 = uVar14;
    pAVar7 = TreeDecomposition::getAttribute
                       ((local_50->_td).
                        super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        local_50->sortOrders[*local_48][uVar14]);
    local_98[0] = local_88;
    std::__cxx11::string::_M_construct((ulong)local_98,'\t');
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)local_98);
    local_138 = &local_128;
    plVar5 = puVar6 + 2;
    if ((long *)*puVar6 == plVar5) {
      local_128 = *plVar5;
      lStack_120 = puVar6[3];
    }
    else {
      local_128 = *plVar5;
      local_138 = (long *)*puVar6;
    }
    local_130 = puVar6[1];
    *puVar6 = plVar5;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_138,(ulong)(pAVar7->_name)._M_dataplus._M_p);
    local_178 = &local_168;
    puVar9 = puVar6 + 2;
    if ((ulong *)*puVar6 == puVar9) {
      local_168 = *puVar9;
      lStack_160 = puVar6[3];
    }
    else {
      local_168 = *puVar9;
      local_178 = (ulong *)*puVar6;
    }
    local_170 = puVar6[1];
    *puVar6 = puVar9;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_178);
    local_118 = &local_108;
    plVar5 = puVar6 + 2;
    if ((long *)*puVar6 == plVar5) {
      local_108 = *plVar5;
      lStack_100 = puVar6[3];
    }
    else {
      local_108 = *plVar5;
      local_118 = (long *)*puVar6;
    }
    local_110 = puVar6[1];
    *puVar6 = plVar5;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_118,(ulong)(pAVar7->_name)._M_dataplus._M_p);
    local_198 = &local_188;
    plVar5 = puVar6 + 2;
    if ((long *)*puVar6 == plVar5) {
      local_188 = *plVar5;
      lStack_180 = puVar6[3];
    }
    else {
      local_188 = *plVar5;
      local_198 = (long *)*puVar6;
    }
    local_190 = puVar6[1];
    *puVar6 = plVar5;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_198);
    local_158 = &local_148;
    puVar9 = puVar6 + 2;
    if ((ulong *)*puVar6 == puVar9) {
      local_148 = *puVar9;
      lStack_140 = puVar6[3];
    }
    else {
      local_148 = *puVar9;
      local_158 = (ulong *)*puVar6;
    }
    local_150 = puVar6[1];
    *puVar6 = puVar9;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    local_f8 = local_e8;
    std::__cxx11::string::_M_construct((ulong)&local_f8,'\f');
    uVar14 = 0xf;
    if (local_158 != &local_148) {
      uVar14 = local_148;
    }
    if (uVar14 < (ulong)(local_f0 + local_150)) {
      uVar14 = 0xf;
      if (local_f8 != local_e8) {
        uVar14 = local_e8[0];
      }
      if (uVar14 < (ulong)(local_f0 + local_150)) goto LAB_00220c11;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,(ulong)local_158);
    }
    else {
LAB_00220c11:
      puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_f8);
    }
    local_1d8 = &local_1c8;
    puVar9 = puVar6 + 2;
    if ((ulong *)*puVar6 == puVar9) {
      local_1c8 = *puVar9;
      uStack_1c0 = puVar6[3];
    }
    else {
      local_1c8 = *puVar9;
      local_1d8 = (ulong *)*puVar6;
    }
    local_1d0 = puVar6[1];
    *puVar6 = puVar9;
    puVar6[1] = 0;
    *(undefined1 *)puVar9 = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_1d8);
    local_1f8 = &local_1e8;
    puVar9 = puVar6 + 2;
    if ((ulong *)*puVar6 == puVar9) {
      local_1e8 = *puVar9;
      lStack_1e0 = puVar6[3];
    }
    else {
      local_1e8 = *puVar9;
      local_1f8 = (ulong *)*puVar6;
    }
    local_1f0 = puVar6[1];
    *puVar6 = puVar9;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_1f8,(ulong)(pAVar7->_name)._M_dataplus._M_p);
    local_1b8 = &local_1a8;
    plVar5 = puVar6 + 2;
    if ((long *)*puVar6 == plVar5) {
      local_1a8 = *plVar5;
      lStack_1a0 = puVar6[3];
    }
    else {
      local_1a8 = *plVar5;
      local_1b8 = (long *)*puVar6;
    }
    local_1b0 = puVar6[1];
    *puVar6 = plVar5;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_1b8);
    local_218 = &local_208;
    puVar9 = puVar6 + 2;
    if ((ulong *)*puVar6 == puVar9) {
      local_208 = *puVar9;
      lStack_200 = puVar6[3];
    }
    else {
      local_208 = *puVar9;
      local_218 = (ulong *)*puVar6;
    }
    local_210 = puVar6[1];
    *puVar6 = puVar9;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_218,(ulong)(pAVar7->_name)._M_dataplus._M_p);
    local_238 = &local_228;
    puVar9 = puVar6 + 2;
    if ((ulong *)*puVar6 == puVar9) {
      local_228 = *puVar9;
      uStack_220 = puVar6[3];
    }
    else {
      local_228 = *puVar9;
      local_238 = (ulong *)*puVar6;
    }
    local_230 = puVar6[1];
    *puVar6 = puVar9;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_238);
    local_258 = &local_248;
    plVar5 = puVar6 + 2;
    if ((long *)*puVar6 == plVar5) {
      local_248 = *plVar5;
      lStack_240 = puVar6[3];
    }
    else {
      local_248 = *plVar5;
      local_258 = (long *)*puVar6;
    }
    local_250 = puVar6[1];
    *puVar6 = plVar5;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_258);
    if (local_258 != &local_248) {
      operator_delete(local_258);
    }
    if (local_238 != &local_228) {
      operator_delete(local_238);
    }
    if (local_218 != &local_208) {
      operator_delete(local_218);
    }
    if (local_1b8 != &local_1a8) {
      operator_delete(local_1b8);
    }
    if (local_1f8 != &local_1e8) {
      operator_delete(local_1f8);
    }
    if (local_1d8 != &local_1c8) {
      operator_delete(local_1d8);
    }
    if (local_f8 != local_e8) {
      operator_delete(local_f8);
    }
    if (local_158 != &local_148) {
      operator_delete(local_158);
    }
    if (local_198 != &local_188) {
      operator_delete(local_198);
    }
    if (local_118 != &local_108) {
      operator_delete(local_118);
    }
    if (local_178 != &local_168) {
      operator_delete(local_178);
    }
    if (local_138 != &local_128) {
      operator_delete(local_138);
    }
    if (local_98[0] != local_88) {
      operator_delete(local_98[0]);
    }
    uVar14 = local_38 + 1;
  }
  local_1b8 = &local_1a8;
  std::__cxx11::string::_M_construct((ulong)&local_1b8,'\t');
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_1b8);
  psVar2 = local_58;
  puVar9 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar9) {
    local_208 = *puVar9;
    lStack_200 = plVar5[3];
    local_218 = &local_208;
  }
  else {
    local_208 = *puVar9;
    local_218 = (ulong *)*plVar5;
  }
  local_210 = plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_1f8 = &local_1e8;
  std::__cxx11::string::_M_construct((ulong)&local_1f8,'\x06');
  uVar14 = 0xf;
  if (local_218 != &local_208) {
    uVar14 = local_208;
  }
  if (uVar14 < (ulong)(local_1f0 + local_210)) {
    uVar14 = 0xf;
    if (local_1f8 != &local_1e8) {
      uVar14 = local_1e8;
    }
    if (uVar14 < (ulong)(local_1f0 + local_210)) goto LAB_0022109d;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1f8,0,(char *)0x0,(ulong)local_218);
  }
  else {
LAB_0022109d:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_218,(ulong)local_1f8);
  }
  puVar9 = puVar6 + 2;
  if ((ulong *)*puVar6 == puVar9) {
    local_228 = *puVar9;
    uStack_220 = puVar6[3];
    local_238 = &local_228;
  }
  else {
    local_228 = *puVar9;
    local_238 = (ulong *)*puVar6;
  }
  local_230 = puVar6[1];
  *puVar6 = puVar9;
  puVar6[1] = 0;
  *(undefined1 *)puVar9 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_238);
  local_258 = &local_248;
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_248 = *plVar8;
    lStack_240 = plVar5[3];
  }
  else {
    local_248 = *plVar8;
    local_258 = (long *)*plVar5;
  }
  local_250 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_258);
  if (local_258 != &local_248) {
    operator_delete(local_258);
  }
  if (local_238 != &local_228) {
    operator_delete(local_238);
  }
  if (local_1f8 != &local_1e8) {
    operator_delete(local_1f8);
  }
  if (local_218 != &local_208) {
    operator_delete(local_218);
  }
  if (local_1b8 != &local_1a8) {
    operator_delete(local_1b8);
  }
  if (multifaq::cppgen::BENCH_INDIVIDUAL != '\x01') goto LAB_0022164a;
  local_118 = &local_108;
  std::__cxx11::string::_M_construct((ulong)&local_118,'\x06');
  puVar6 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_118,0,(char *)0x0,0x2afdd1);
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_188 = *plVar5;
    lStack_180 = puVar6[3];
    local_198 = &local_188;
  }
  else {
    local_188 = *plVar5;
    local_198 = (long *)*puVar6;
  }
  local_190 = puVar6[1];
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_198);
  local_158 = &local_148;
  puVar9 = puVar6 + 2;
  if ((ulong *)*puVar6 == puVar9) {
    local_148 = *puVar9;
    lStack_140 = puVar6[3];
  }
  else {
    local_148 = *puVar9;
    local_158 = (ulong *)*puVar6;
  }
  local_150 = puVar6[1];
  *puVar6 = puVar9;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_158);
  puVar9 = puVar6 + 2;
  local_178 = &local_168;
  if ((ulong *)*puVar6 == puVar9) {
    local_1c8 = *puVar9;
    uStack_1c0 = puVar6[3];
    local_1d8 = &local_1c8;
  }
  else {
    local_1c8 = *puVar9;
    local_1d8 = (ulong *)*puVar6;
  }
  local_1d0 = puVar6[1];
  *puVar6 = puVar9;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  std::__cxx11::string::_M_construct((ulong)&local_178,'\x06');
  uVar14 = 0xf;
  if (local_1d8 != &local_1c8) {
    uVar14 = local_1c8;
  }
  if (uVar14 < (ulong)(local_170 + local_1d0)) {
    uVar14 = 0xf;
    if (local_178 != &local_168) {
      uVar14 = local_168;
    }
    if (uVar14 < (ulong)(local_170 + local_1d0)) goto LAB_0022139e;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_178,0,(char *)0x0,(ulong)local_1d8);
  }
  else {
LAB_0022139e:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1d8,(ulong)local_178);
  }
  puVar9 = puVar6 + 2;
  if ((ulong *)*puVar6 == puVar9) {
    local_1e8 = *puVar9;
    lStack_1e0 = puVar6[3];
    local_1f8 = &local_1e8;
  }
  else {
    local_1e8 = *puVar9;
    local_1f8 = (ulong *)*puVar6;
  }
  local_1f0 = puVar6[1];
  *puVar6 = puVar9;
  puVar6[1] = 0;
  *(undefined1 *)puVar9 = 0;
  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_1f8);
  local_1b8 = &local_1a8;
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_1a8 = *plVar5;
    lStack_1a0 = puVar6[3];
  }
  else {
    local_1a8 = *plVar5;
    local_1b8 = (long *)*puVar6;
  }
  local_1b0 = puVar6[1];
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1b8,(ulong)local_d8[0]);
  puVar9 = puVar6 + 2;
  if ((ulong *)*puVar6 == puVar9) {
    local_208 = *puVar9;
    lStack_200 = puVar6[3];
    local_218 = &local_208;
  }
  else {
    local_208 = *puVar9;
    local_218 = (ulong *)*puVar6;
  }
  local_210 = puVar6[1];
  *puVar6 = puVar9;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_218);
  puVar9 = puVar6 + 2;
  if ((ulong *)*puVar6 == puVar9) {
    local_228 = *puVar9;
    uStack_220 = puVar6[3];
    local_238 = &local_228;
  }
  else {
    local_228 = *puVar9;
    local_238 = (ulong *)*puVar6;
  }
  local_230 = puVar6[1];
  *puVar6 = puVar9;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_238);
  local_258 = &local_248;
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_248 = *plVar5;
    lStack_240 = puVar6[3];
  }
  else {
    local_248 = *plVar5;
    local_258 = (long *)*puVar6;
  }
  local_250 = puVar6[1];
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_258);
  if (local_258 != &local_248) {
    operator_delete(local_258);
  }
  if (local_238 != &local_228) {
    operator_delete(local_238);
  }
  if (local_218 != &local_208) {
    operator_delete(local_218);
  }
  if (local_1b8 != &local_1a8) {
    operator_delete(local_1b8);
  }
  if (local_1f8 != &local_1e8) {
    operator_delete(local_1f8);
  }
  if (local_178 != &local_168) {
    operator_delete(local_178);
  }
  if (local_1d8 != &local_1c8) {
    operator_delete(local_1d8);
  }
  if (local_158 != &local_148) {
    operator_delete(local_158);
  }
  if (local_198 != &local_188) {
    operator_delete(local_198);
  }
  if (local_118 != &local_108) {
    operator_delete(local_118);
  }
LAB_0022164a:
  local_238 = &local_228;
  std::__cxx11::string::_M_construct((ulong)&local_238,'\x03');
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_238,0,(char *)0x0,(ulong)local_b8);
  local_258 = &local_248;
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_248 = *plVar8;
    lStack_240 = plVar5[3];
  }
  else {
    local_248 = *plVar8;
    local_258 = (long *)*plVar5;
  }
  local_250 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_258);
  (psVar2->_M_dataplus)._M_p = (pointer)&psVar2->field_2;
  psVar11 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar11) {
    lVar13 = plVar5[3];
    (psVar2->field_2)._M_allocated_capacity = *psVar11;
    *(long *)((long)&psVar2->field_2 + 8) = lVar13;
  }
  else {
    (psVar2->_M_dataplus)._M_p = (pointer)*plVar5;
    (psVar2->field_2)._M_allocated_capacity = *psVar11;
  }
  psVar2->_M_string_length = plVar5[1];
  *plVar5 = (long)psVar11;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (local_258 != &local_248) {
    operator_delete(local_258);
  }
  if (local_238 != &local_228) {
    operator_delete(local_238);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0]);
  }
  if (local_d8[0] != local_c8) {
    operator_delete(local_d8[0]);
  }
  return psVar2;
}

Assistant:

std::string CppGenerator::genSortFunction(const size_t& rel_id)
{
    TDNode* relation = _td->getRelation(rel_id);
    std::string relName = relation->_name;

#if defined(__GNUC__) && defined(NDEBUG) && !defined(__clang__)
    std::string sortAlgo = "__gnu_parallel::sort(";
#else
    std::string sortAlgo = "std::sort(";
#endif
    
    std::string returnString = offset(1)+"void sort"+relName+"()\n"+offset(1)+"{\n";

    if (BENCH_INDIVIDUAL)
        returnString += offset(2)+"int64_t startProcess = duration_cast<milliseconds>("+
            "system_clock::now().time_since_epoch()).count();\n\n";

    returnString += offset(2)+sortAlgo+relName+".begin(),"+
        relName+".end(),[ ](const "+relName+"_tuple& lhs, const "+relName+
        "_tuple& rhs)\n"+offset(2)+"{\n";

    // size_t orderIdx = 0;
    // for (const size_t& var : varOrder)
    // {
    //     if (baseRelation->_bag[var])
    //     {
    //         const std::string& attrName = _td->getAttribute(var)->_name;
    //         returnString += offset(3)+"if(lhs."+attrName+" != rhs."+attrName+")\n"+
    //             offset(4)+"return lhs."+attrName+" < rhs."+attrName+";\n";
    //         // Reset the relSortOrder array for future calls 
    //         sortOrders[view->_origin][orderIdx] = var;
    //         ++orderIdx;
    //     }
    // }

    for (size_t var = 0; var < relation->_bag.count(); ++var)
    {
        const std::string& attrName = _td->getAttribute(sortOrders[rel_id][var])->_name;
        returnString += offset(3)+"if(lhs."+attrName+" != rhs."+attrName+")\n"+
            offset(4)+"return lhs."+attrName+" < rhs."+attrName+";\n";
    }
    returnString += offset(3)+"return false;\n"+offset(2)+"});\n";

    if (BENCH_INDIVIDUAL)
        returnString += "\n"+offset(2)+
            "int64_t endProcess = duration_cast<milliseconds>("+
            "system_clock::now().time_since_epoch()).count()-startProcess;\n"+
            offset(2)+"std::cout << \"Sort Relation "+relName+": \"+"+
            "std::to_string(endProcess)+\"ms.\\n\";\n\n";    
        // offset(2)+"std::ofstream ofs(\"times.txt\",std::ofstream::out | " +
        // "std::ofstream::app);\n"+
        // offset(2)+"ofs << \"\\t\" << endProcess;\n"+
        // offset(2)+"ofs.close();\n";
    
    return returnString+offset(1)+"}\n";
}